

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

ON_OBSOLETE_V2_DimAngular *
ON_OBSOLETE_V2_DimAngular::CreateFromV5AngularDimension
          (ON_OBSOLETE_V5_DimAngular *V5_angular_dimension,
          ON_3dmAnnotationContext *annotation_context,ON_OBSOLETE_V2_DimAngular *destination)

{
  double dVar1;
  ON_3dPoint point;
  ON_3dPoint point_00;
  ON_3dPoint point_01;
  ON_3dPoint point_02;
  ON_2dPoint OVar2;
  ON_OBSOLETE_V2_DimAngular *local_108;
  ON_2dPoint local_100;
  ON_3dPoint local_f0;
  ON_2dPoint local_d8;
  ON_3dPoint local_c8;
  ON_2dPoint local_b0;
  ON_3dPoint local_a0;
  ON_2dPoint local_88;
  ON_3dPoint local_78;
  undefined1 local_60 [8];
  ON_SimpleArray<ON_2dPoint> V5_points;
  ON_OBSOLETE_V2_DimAngular *V2_angular_dimension;
  ON_OBSOLETE_V2_DimAngular *destination_local;
  ON_3dmAnnotationContext *annotation_context_local;
  ON_OBSOLETE_V5_DimAngular *V5_angular_dimension_local;
  
  local_108 = destination;
  if (destination == (ON_OBSOLETE_V2_DimAngular *)0x0) {
    local_108 = (ON_OBSOLETE_V2_DimAngular *)operator_new(0xd8);
    ON_OBSOLETE_V2_DimAngular(local_108);
  }
  ON_OBSOLETE_V2_Annotation::Internal_InitializeFromV5Annotation
            (&local_108->super_ON_OBSOLETE_V2_Annotation,
             &V5_angular_dimension->super_ON_OBSOLETE_V5_Annotation,annotation_context);
  ON_SimpleArray<ON_2dPoint>::ON_SimpleArray
            ((ON_SimpleArray<ON_2dPoint> *)local_60,
             &(V5_angular_dimension->super_ON_OBSOLETE_V5_Annotation).m_points.
              super_ON_SimpleArray<ON_2dPoint>);
  ON_SimpleArray<ON_2dPoint>::SetCount(&(local_108->super_ON_OBSOLETE_V2_Annotation).m_points,0);
  OVar2 = ON_OBSOLETE_V5_Annotation::Point(&V5_angular_dimension->super_ON_OBSOLETE_V5_Annotation,1)
  ;
  local_88.y = OVar2.y;
  local_88.x = OVar2.x;
  ON_3dPoint::ON_3dPoint(&local_78,&local_88);
  point.y = local_78.y;
  point.x = local_78.x;
  point.z = local_78.z;
  ON_OBSOLETE_V2_Annotation::SetPoint(&local_108->super_ON_OBSOLETE_V2_Annotation,0,point);
  OVar2 = ON_OBSOLETE_V5_Annotation::Point(&V5_angular_dimension->super_ON_OBSOLETE_V5_Annotation,2)
  ;
  local_b0.y = OVar2.y;
  local_b0.x = OVar2.x;
  ON_3dPoint::ON_3dPoint(&local_a0,&local_b0);
  point_00.y = local_a0.y;
  point_00.x = local_a0.x;
  point_00.z = local_a0.z;
  ON_OBSOLETE_V2_Annotation::SetPoint(&local_108->super_ON_OBSOLETE_V2_Annotation,1,point_00);
  OVar2 = ON_OBSOLETE_V5_Annotation::Point(&V5_angular_dimension->super_ON_OBSOLETE_V5_Annotation,3)
  ;
  local_d8.y = OVar2.y;
  local_d8.x = OVar2.x;
  ON_3dPoint::ON_3dPoint(&local_c8,&local_d8);
  point_01.y = local_c8.y;
  point_01.x = local_c8.x;
  point_01.z = local_c8.z;
  ON_OBSOLETE_V2_Annotation::SetPoint(&local_108->super_ON_OBSOLETE_V2_Annotation,2,point_01);
  OVar2 = ON_OBSOLETE_V5_Annotation::Point(&V5_angular_dimension->super_ON_OBSOLETE_V5_Annotation,0)
  ;
  local_100.y = OVar2.y;
  local_100.x = OVar2.x;
  ON_3dPoint::ON_3dPoint(&local_f0,&local_100);
  point_02.y = local_f0.y;
  point_02.x = local_f0.x;
  point_02.z = local_f0.z;
  ON_OBSOLETE_V2_Annotation::SetPoint(&local_108->super_ON_OBSOLETE_V2_Annotation,3,point_02);
  dVar1 = ON_OBSOLETE_V5_DimAngular::Angle(V5_angular_dimension);
  SetAngle(local_108,dVar1);
  dVar1 = ON_OBSOLETE_V5_DimAngular::Radius(V5_angular_dimension);
  SetRadius(local_108,dVar1);
  ON_SimpleArray<ON_2dPoint>::~ON_SimpleArray((ON_SimpleArray<ON_2dPoint> *)local_60);
  return local_108;
}

Assistant:

ON_OBSOLETE_V2_DimAngular* ON_OBSOLETE_V2_DimAngular::CreateFromV5AngularDimension(
  const class ON_OBSOLETE_V5_DimAngular& V5_angular_dimension,
  const ON_3dmAnnotationContext* annotation_context,
  ON_OBSOLETE_V2_DimAngular* destination
)
{
  ON_OBSOLETE_V2_DimAngular* V2_angular_dimension
    = (nullptr != destination)
    ? destination
    : new ON_OBSOLETE_V2_DimAngular();
  V2_angular_dimension->Internal_InitializeFromV5Annotation(V5_angular_dimension,annotation_context);
  ON_SimpleArray<ON_2dPoint> V5_points(V5_angular_dimension.m_points);
  V2_angular_dimension->m_points.SetCount(0);
  V2_angular_dimension->SetPoint(0, ON_3dPoint(V5_angular_dimension.Point(1)));
  V2_angular_dimension->SetPoint(1, ON_3dPoint(V5_angular_dimension.Point(2)));
  V2_angular_dimension->SetPoint(2, ON_3dPoint(V5_angular_dimension.Point(3)));
  V2_angular_dimension->SetPoint(3, ON_3dPoint(V5_angular_dimension.Point(0))); // text point or apex
  V2_angular_dimension->SetAngle( V5_angular_dimension.Angle());
  V2_angular_dimension->SetRadius( V5_angular_dimension.Radius());

  return V2_angular_dimension;
}